

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

string * tinyusdz::tydra::DumpRenderScene
                   (string *__return_storage_ptr__,RenderScene *scene,string *format)

{
  ulong uVar1;
  string *s;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  const_reference this;
  const_reference this_00;
  const_reference this_01;
  const_reference this_02;
  const_reference this_03;
  const_reference this_04;
  const_reference this_05;
  const_reference this_06;
  const_reference this_07;
  uint32_t uVar5;
  string local_358;
  ulong local_338;
  size_t i_8;
  ulong local_310;
  size_t i_7;
  ulong local_2e8;
  size_t i_6;
  ulong local_2c0;
  size_t i_5;
  ulong local_298;
  size_t i_4;
  ulong local_270;
  size_t i_3;
  ulong local_248;
  size_t i_2;
  ulong local_220;
  size_t i_1;
  ulong local_1f8;
  size_t i;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [376];
  string *local_20;
  string *format_local;
  RenderScene *scene_local;
  
  local_20 = format;
  format_local = &scene->usd_filename;
  scene_local = (RenderScene *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_20,"json");
  if (bVar2) {
    ::std::operator<<(aoStack_198,"// `json` format is not supported yet. Use KDL format\n");
  }
  poVar3 = ::std::operator<<(aoStack_198,"title ");
  s = format_local;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_1e8,"\"",(allocator *)((long)&i + 7));
  quote(&local_1c8,s,&local_1e8);
  poVar3 = ::std::operator<<(poVar3,(string *)&local_1c8);
  ::std::operator<<(poVar3,"\n");
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  poVar3 = ::std::operator<<(aoStack_198,"default_root_node ");
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,*(uint *)(format_local + 6));
  ::std::operator<<(poVar3,"\n");
  poVar3 = ::std::operator<<(aoStack_198,"// # of Root Nodes : ");
  sVar4 = ::std::vector<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>::size
                    ((vector<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_> *)
                     &format_local[6]._M_string_length);
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,sVar4);
  ::std::operator<<(poVar3,"\n");
  poVar3 = ::std::operator<<(aoStack_198,"// # of Meshes : ");
  sVar4 = ::std::vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>::
          size((vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_> *)
               ((long)&format_local[10].field_2 + 8));
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,sVar4);
  ::std::operator<<(poVar3,"\n");
  poVar3 = ::std::operator<<(aoStack_198,"// # of Skeletons : ");
  sVar4 = ::std::
          vector<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>::
          size((vector<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
                *)&format_local[0xc]._M_string_length);
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,sVar4);
  ::std::operator<<(poVar3,"\n");
  poVar3 = ::std::operator<<(aoStack_198,"// # of Animations : ");
  sVar4 = ::std::vector<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>::
          size((vector<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_> *)
               &format_local[0xb].field_2);
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,sVar4);
  ::std::operator<<(poVar3,"\n");
  poVar3 = ::std::operator<<(aoStack_198,"// # of Cameras : ");
  sVar4 = ::std::
          vector<tinyusdz::tydra::RenderCamera,_std::allocator<tinyusdz::tydra::RenderCamera>_>::
          size((vector<tinyusdz::tydra::RenderCamera,_std::allocator<tinyusdz::tydra::RenderCamera>_>
                *)&format_local[8].field_2);
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,sVar4);
  ::std::operator<<(poVar3,"\n");
  poVar3 = ::std::operator<<(aoStack_198,"// # of Materials : ");
  sVar4 = ::std::
          vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
          ::size((vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                  *)((long)&format_local[7].field_2 + 8));
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,sVar4);
  ::std::operator<<(poVar3,"\n");
  poVar3 = ::std::operator<<(aoStack_198,"// # of UVTextures : ");
  sVar4 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>::
          size((vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_> *)
               (format_local + 10));
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,sVar4);
  ::std::operator<<(poVar3,"\n");
  poVar3 = ::std::operator<<(aoStack_198,"// # of TextureImages : ");
  sVar4 = ::std::
          vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>::
          size((vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                *)(format_local + 7));
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,sVar4);
  ::std::operator<<(poVar3,"\n");
  poVar3 = ::std::operator<<(aoStack_198,"// # of Buffers : ");
  sVar4 = ::std::vector<tinyusdz::tydra::BufferData,_std::allocator<tinyusdz::tydra::BufferData>_>::
          size((vector<tinyusdz::tydra::BufferData,_std::allocator<tinyusdz::tydra::BufferData>_> *)
               (format_local + 0xd));
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,sVar4);
  ::std::operator<<(poVar3,"\n");
  ::std::operator<<(aoStack_198,"\n");
  ::std::operator<<(aoStack_198,"nodes {\n");
  for (local_1f8 = 0; uVar1 = local_1f8,
      sVar4 = ::std::vector<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>::size
                        ((vector<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_> *)
                         &format_local[6]._M_string_length), uVar1 < sVar4;
      local_1f8 = local_1f8 + 1) {
    this = ::std::vector<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>::operator[]
                     ((vector<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_> *)
                      &format_local[6]._M_string_length,local_1f8);
    (anonymous_namespace)::DumpNode_abi_cxx11_
              ((string *)&i_1,(_anonymous_namespace_ *)this,(Node *)0x1,(uint32_t)sVar4);
    ::std::operator<<(aoStack_198,(string *)&i_1);
    ::std::__cxx11::string::~string((string *)&i_1);
  }
  ::std::operator<<(aoStack_198,"}\n");
  ::std::operator<<(aoStack_198,"meshes {\n");
  for (local_220 = 0; uVar1 = local_220,
      sVar4 = ::std::
              vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>::
              size((vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                    *)((long)&format_local[10].field_2 + 8)), uVar1 < sVar4;
      local_220 = local_220 + 1) {
    poVar3 = ::std::operator<<(aoStack_198,"[");
    uVar5 = (uint32_t)sVar4;
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,local_220);
    poVar3 = ::std::operator<<(poVar3,"] ");
    this_00 = ::std::
              vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>::
              operator[]((vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                          *)((long)&format_local[10].field_2 + 8),local_220);
    (anonymous_namespace)::DumpMesh_abi_cxx11_
              ((string *)&i_2,(_anonymous_namespace_ *)this_00,(RenderMesh *)0x1,uVar5);
    ::std::operator<<(poVar3,(string *)&i_2);
    ::std::__cxx11::string::~string((string *)&i_2);
  }
  ::std::operator<<(aoStack_198,"}\n");
  ::std::operator<<(aoStack_198,"skeletons {\n");
  for (local_248 = 0; uVar1 = local_248,
      sVar4 = ::std::
              vector<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
              ::size((vector<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
                      *)&format_local[0xc]._M_string_length), uVar1 < sVar4;
      local_248 = local_248 + 1) {
    poVar3 = ::std::operator<<(aoStack_198,"[");
    uVar5 = (uint32_t)sVar4;
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,local_248);
    poVar3 = ::std::operator<<(poVar3,"] ");
    this_01 = ::std::
              vector<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
              ::operator[]((vector<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
                            *)&format_local[0xc]._M_string_length,local_248);
    (anonymous_namespace)::DumpSkeleton_abi_cxx11_
              ((string *)&i_3,(_anonymous_namespace_ *)this_01,(SkelHierarchy *)0x1,uVar5);
    ::std::operator<<(poVar3,(string *)&i_3);
    ::std::__cxx11::string::~string((string *)&i_3);
  }
  ::std::operator<<(aoStack_198,"}\n");
  ::std::operator<<(aoStack_198,"animations {\n");
  for (local_270 = 0; uVar1 = local_270,
      sVar4 = ::std::vector<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>
              ::size((vector<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>
                      *)&format_local[0xb].field_2), uVar1 < sVar4; local_270 = local_270 + 1) {
    poVar3 = ::std::operator<<(aoStack_198,"[");
    uVar5 = (uint32_t)sVar4;
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,local_270);
    poVar3 = ::std::operator<<(poVar3,"] ");
    this_02 = ::std::vector<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>
              ::operator[]((vector<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>
                            *)&format_local[0xb].field_2,local_270);
    (anonymous_namespace)::DumpAnimation_abi_cxx11_
              ((string *)&i_4,(_anonymous_namespace_ *)this_02,(Animation *)0x1,uVar5);
    ::std::operator<<(poVar3,(string *)&i_4);
    ::std::__cxx11::string::~string((string *)&i_4);
  }
  ::std::operator<<(aoStack_198,"}\n");
  ::std::operator<<(aoStack_198,"cameras {\n");
  for (local_298 = 0; uVar1 = local_298,
      sVar4 = ::std::
              vector<tinyusdz::tydra::RenderCamera,_std::allocator<tinyusdz::tydra::RenderCamera>_>
              ::size((vector<tinyusdz::tydra::RenderCamera,_std::allocator<tinyusdz::tydra::RenderCamera>_>
                      *)&format_local[8].field_2), uVar1 < sVar4; local_298 = local_298 + 1) {
    poVar3 = ::std::operator<<(aoStack_198,"[");
    uVar5 = (uint32_t)sVar4;
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,local_298);
    poVar3 = ::std::operator<<(poVar3,"] ");
    this_03 = ::std::
              vector<tinyusdz::tydra::RenderCamera,_std::allocator<tinyusdz::tydra::RenderCamera>_>
              ::operator[]((vector<tinyusdz::tydra::RenderCamera,_std::allocator<tinyusdz::tydra::RenderCamera>_>
                            *)&format_local[8].field_2,local_298);
    (anonymous_namespace)::DumpCamera_abi_cxx11_
              ((string *)&i_5,(_anonymous_namespace_ *)this_03,(RenderCamera *)0x1,uVar5);
    ::std::operator<<(poVar3,(string *)&i_5);
    ::std::__cxx11::string::~string((string *)&i_5);
  }
  ::std::operator<<(aoStack_198,"}\n");
  ::std::operator<<(aoStack_198,"\n");
  ::std::operator<<(aoStack_198,"materials {\n");
  for (local_2c0 = 0; uVar1 = local_2c0,
      sVar4 = ::std::
              vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
              ::size((vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                      *)((long)&format_local[7].field_2 + 8)), uVar1 < sVar4;
      local_2c0 = local_2c0 + 1) {
    poVar3 = ::std::operator<<(aoStack_198,"[");
    uVar5 = (uint32_t)sVar4;
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,local_2c0);
    poVar3 = ::std::operator<<(poVar3,"] ");
    this_04 = ::std::
              vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
              ::operator[]((vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                            *)((long)&format_local[7].field_2 + 8),local_2c0);
    (anonymous_namespace)::DumpMaterial_abi_cxx11_
              ((string *)&i_6,(_anonymous_namespace_ *)this_04,(RenderMaterial *)0x1,uVar5);
    ::std::operator<<(poVar3,(string *)&i_6);
    ::std::__cxx11::string::~string((string *)&i_6);
  }
  ::std::operator<<(aoStack_198,"}\n");
  ::std::operator<<(aoStack_198,"\n");
  ::std::operator<<(aoStack_198,"textures {\n");
  for (local_2e8 = 0; uVar1 = local_2e8,
      sVar4 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
              ::size((vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                      *)(format_local + 10)), uVar1 < sVar4; local_2e8 = local_2e8 + 1) {
    poVar3 = ::std::operator<<(aoStack_198,"[");
    uVar5 = (uint32_t)sVar4;
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,local_2e8);
    poVar3 = ::std::operator<<(poVar3,"] ");
    this_05 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
              ::operator[]((vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                            *)(format_local + 10),local_2e8);
    (anonymous_namespace)::DumpUVTexture_abi_cxx11_
              ((string *)&i_7,(_anonymous_namespace_ *)this_05,(UVTexture *)0x1,uVar5);
    ::std::operator<<(poVar3,(string *)&i_7);
    ::std::__cxx11::string::~string((string *)&i_7);
  }
  ::std::operator<<(aoStack_198,"}\n");
  ::std::operator<<(aoStack_198,"\n");
  ::std::operator<<(aoStack_198,"images {\n");
  for (local_310 = 0; uVar1 = local_310,
      sVar4 = ::std::
              vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
              ::size((vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                      *)(format_local + 7)), uVar1 < sVar4; local_310 = local_310 + 1) {
    poVar3 = ::std::operator<<(aoStack_198,"[");
    uVar5 = (uint32_t)sVar4;
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,local_310);
    poVar3 = ::std::operator<<(poVar3,"] ");
    this_06 = ::std::
              vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
              ::operator[]((vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                            *)(format_local + 7),local_310);
    (anonymous_namespace)::DumpImage_abi_cxx11_
              ((string *)&i_8,(_anonymous_namespace_ *)this_06,(TextureImage *)0x1,uVar5);
    ::std::operator<<(poVar3,(string *)&i_8);
    ::std::__cxx11::string::~string((string *)&i_8);
  }
  ::std::operator<<(aoStack_198,"}\n");
  ::std::operator<<(aoStack_198,"\n");
  ::std::operator<<(aoStack_198,"buffers {\n");
  for (local_338 = 0; uVar1 = local_338,
      sVar4 = ::std::
              vector<tinyusdz::tydra::BufferData,_std::allocator<tinyusdz::tydra::BufferData>_>::
              size((vector<tinyusdz::tydra::BufferData,_std::allocator<tinyusdz::tydra::BufferData>_>
                    *)(format_local + 0xd)), uVar1 < sVar4; local_338 = local_338 + 1) {
    poVar3 = ::std::operator<<(aoStack_198,"[");
    uVar5 = (uint32_t)sVar4;
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,local_338);
    poVar3 = ::std::operator<<(poVar3,"] ");
    this_07 = ::std::
              vector<tinyusdz::tydra::BufferData,_std::allocator<tinyusdz::tydra::BufferData>_>::
              operator[]((vector<tinyusdz::tydra::BufferData,_std::allocator<tinyusdz::tydra::BufferData>_>
                          *)(format_local + 0xd),local_338);
    (anonymous_namespace)::DumpBuffer_abi_cxx11_
              (&local_358,(_anonymous_namespace_ *)this_07,(BufferData *)0x1,uVar5);
    ::std::operator<<(poVar3,(string *)&local_358);
    ::std::__cxx11::string::~string((string *)&local_358);
  }
  ::std::operator<<(aoStack_198,"}\n");
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string DumpRenderScene(const RenderScene &scene,
                            const std::string &format) {
  std::stringstream ss;

  if (format == "json") {
    // TODO:
    // Currently kdl only.
    ss << "// `json` format is not supported yet. Use KDL format\n";
  }

  ss << "title " << quote(scene.usd_filename) << "\n";
  ss << "default_root_node " << scene.default_root_node << "\n";
  ss << "// # of Root Nodes : " << scene.nodes.size() << "\n";
  ss << "// # of Meshes : " << scene.meshes.size() << "\n";
  ss << "// # of Skeletons : " << scene.skeletons.size() << "\n";
  ss << "// # of Animations : " << scene.animations.size() << "\n";
  ss << "// # of Cameras : " << scene.cameras.size() << "\n";
  ss << "// # of Materials : " << scene.materials.size() << "\n";
  ss << "// # of UVTextures : " << scene.textures.size() << "\n";
  ss << "// # of TextureImages : " << scene.images.size() << "\n";
  ss << "// # of Buffers : " << scene.buffers.size() << "\n";

  ss << "\n";

  ss << "nodes {\n";
  for (size_t i = 0; i < scene.nodes.size(); i++) {
    ss << DumpNode(scene.nodes[i], 1);
  }
  ss << "}\n";

  ss << "meshes {\n";
  for (size_t i = 0; i < scene.meshes.size(); i++) {
    ss << "[" << i << "] " << DumpMesh(scene.meshes[i], 1);
  }
  ss << "}\n";

  ss << "skeletons {\n";
  for (size_t i = 0; i < scene.skeletons.size(); i++) {
    ss << "[" << i << "] " << DumpSkeleton(scene.skeletons[i], 1);
  }
  ss << "}\n";

  ss << "animations {\n";
  for (size_t i = 0; i < scene.animations.size(); i++) {
    ss << "[" << i << "] " << DumpAnimation(scene.animations[i], 1);
  }
  ss << "}\n";

  ss << "cameras {\n";
  for (size_t i = 0; i < scene.cameras.size(); i++) {
    ss << "[" << i << "] " << DumpCamera(scene.cameras[i], 1);
  }
  ss << "}\n";

  ss << "\n";
  ss << "materials {\n";
  for (size_t i = 0; i < scene.materials.size(); i++) {
    ss << "[" << i << "] " << DumpMaterial(scene.materials[i], 1);
  }
  ss << "}\n";

  ss << "\n";
  ss << "textures {\n";
  for (size_t i = 0; i < scene.textures.size(); i++) {
    ss << "[" << i << "] " << DumpUVTexture(scene.textures[i], 1);
  }
  ss << "}\n";

  ss << "\n";
  ss << "images {\n";
  for (size_t i = 0; i < scene.images.size(); i++) {
    ss << "[" << i << "] " << DumpImage(scene.images[i], 1);
  }
  ss << "}\n";

  ss << "\n";
  ss << "buffers {\n";
  for (size_t i = 0; i < scene.buffers.size(); i++) {
    ss << "[" << i << "] " << DumpBuffer(scene.buffers[i], 1);
  }
  ss << "}\n";

  // ss << "TODO: AnimationChannel, ...\n";

  return ss.str();
}